

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int PostLoopFinalize(VP8EncIterator *it,int ok)

{
  VP8Encoder *enc;
  uint64_t (*pauVar1) [3];
  int i;
  uint64_t (*pauVar2) [3];
  long lVar3;
  VP8BitWriter *bw;
  int p;
  long lVar4;
  int (*paiVar5) [4];
  
  enc = it->enc_;
  if (ok != 0) {
    bw = enc->parts_;
    for (lVar4 = 0; lVar4 < enc->num_parts_; lVar4 = lVar4 + 1) {
      VP8BitWriterFinish(bw);
      ok = ok & (uint)(bw->error_ == 0);
      bw = bw + 1;
    }
    if (ok != 0) {
      if (enc->pic_->stats != (WebPAuxStats *)0x0) {
        pauVar1 = it->bit_count_;
        paiVar5 = enc->residual_bytes_;
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          pauVar2 = pauVar1;
          for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
            (*paiVar5)[lVar3] = (int)((*pauVar2)[0] + 7 >> 3);
            pauVar2 = pauVar2 + 1;
          }
          pauVar1 = (uint64_t (*) [3])(*pauVar1 + 1);
          paiVar5 = paiVar5 + 1;
        }
      }
      VP8AdjustFilterStrength(it);
      return ok;
    }
  }
  VP8EncFreeBitWriters(enc);
  return 0;
}

Assistant:

static int PostLoopFinalize(VP8EncIterator* const it, int ok) {
  VP8Encoder* const enc = it->enc_;
  if (ok) {      // Finalize the partitions, check for extra errors.
    int p;
    for (p = 0; p < enc->num_parts_; ++p) {
      VP8BitWriterFinish(enc->parts_ + p);
      ok &= !enc->parts_[p].error_;
    }
  }

  if (ok) {      // All good. Finish up.
#if !defined(WEBP_DISABLE_STATS)
    if (enc->pic_->stats != NULL) {  // finalize byte counters...
      int i, s;
      for (i = 0; i <= 2; ++i) {
        for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
          enc->residual_bytes_[i][s] = (int)((it->bit_count_[s][i] + 7) >> 3);
        }
      }
    }
#endif
    VP8AdjustFilterStrength(it);     // ...and store filter stats.
  } else {
    // Something bad happened -> need to do some memory cleanup.
    VP8EncFreeBitWriters(enc);
  }
  return ok;
}